

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_float<char,fmt::v11::basic_appender<char>,long_double>
          (basic_appender<char> out,longdouble value,format_specs specs,locale_ref loc)

{
  string_view bytes;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  format_specs specs_00;
  bool bVar1;
  presentation_type pVar2;
  sign sVar3;
  align aVar4;
  int iVar5;
  char *s_00;
  size_t count;
  size_t *in_RCX;
  size_t in_RDX;
  uchar *sig;
  EVP_PKEY_CTX *in_RSI;
  size_t in_RDI;
  buffer<char> *pbVar6;
  uchar *in_R8;
  size_t in_R9;
  unkbyte10 in_ST0;
  longdouble in_stack_00000008;
  big_decimal_fp f;
  int exp;
  memory_buffer buffer;
  int precision;
  sign s;
  undefined7 uVar7;
  char c;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffc92;
  format_specs *in_stack_fffffffffffffca0;
  undefined2 in_stack_fffffffffffffca8;
  undefined2 in_stack_fffffffffffffcaa;
  undefined2 uVar9;
  undefined4 in_stack_fffffffffffffcac;
  size_t in_stack_fffffffffffffcb0;
  locale_ref loc_00;
  undefined2 in_stack_fffffffffffffcb8;
  undefined2 uVar10;
  undefined2 in_stack_fffffffffffffcba;
  int in_stack_fffffffffffffcbc;
  undefined2 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce2;
  undefined1 in_stack_fffffffffffffce3;
  undefined1 isnan;
  basic_specs __x;
  undefined8 in_stack_fffffffffffffcf0;
  basic_appender<char> in_stack_fffffffffffffcf8;
  integral_constant local_2e9;
  int local_2e8;
  undefined4 local_2e4;
  basic_string_view<char> local_2e0;
  size_t local_2d0;
  EVP_PKEY_CTX *local_2c8;
  size_t sStack_2c0;
  char local_2a2;
  buffer<char> local_2a0;
  buffer<char> *in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd8f;
  format_specs *in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd9c;
  longdouble in_stack_fffffffffffffda0;
  buffer<char> *in_stack_fffffffffffffdc8;
  longdouble in_stack_fffffffffffffdd0;
  format_specs in_stack_fffffffffffffde8;
  int local_84;
  basic_appender<char> local_80;
  EVP_PKEY_CTX *local_78;
  size_t local_70;
  size_t local_68;
  sign local_5c;
  longdouble local_58;
  buffer<char> local_38;
  
  local_58 = in_stack_00000008;
  __x = (basic_specs)(double)in_stack_00000008;
  local_38.ptr_ = (char *)in_RSI;
  local_38.size_ = in_RDX;
  local_38.capacity_ = in_RDI;
  bVar1 = std::signbit((double)__x);
  if (bVar1) {
    sVar3 = minus;
  }
  else {
    sVar3 = basic_specs::sign((basic_specs *)&local_38,in_RSI,sig,in_RCX,in_R8,in_R9);
  }
  uVar7 = SUB107(local_58,0);
  c = (char)((unkuint10)local_58 >> 0x38);
  uVar8 = (undefined2)((unkuint10)local_58 >> 0x40);
  local_5c = sVar3;
  bVar1 = isfinite<long_double,_0>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0));
  isnan = (undefined1)(sVar3 >> 0x18);
  if (bVar1) {
    aVar4 = basic_specs::align((basic_specs *)&local_38);
    if ((aVar4 == numeric) && (local_5c != none)) {
      getsign<char>(local_5c);
      local_80 = basic_appender<char>::operator++((basic_appender<char> *)&local_38.capacity_,0);
      basic_appender<char>::operator*(&local_80);
      basic_appender<char>::operator=
                ((basic_appender<char> *)CONCAT62(in_stack_fffffffffffffc92,uVar8),c);
      local_5c = none;
      if ((int)local_38.size_ != 0) {
        local_38.size_ = CONCAT44(local_38.size_._4_4_,(int)local_38.size_ + -1);
      }
    }
    local_84 = local_38.size_._4_4_;
    if (((long)local_38.size_ < 0) &&
       (pVar2 = basic_specs::type((basic_specs *)&local_38), pVar2 != none)) {
      local_84 = 6;
    }
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)
               CONCAT62(in_stack_fffffffffffffc92,uVar8),(allocator<char> *)CONCAT17(c,uVar7));
    pbVar6 = &local_38;
    pVar2 = basic_specs::type((basic_specs *)pbVar6);
    if (pVar2 == hex) {
      if (local_5c != none) {
        local_2a2 = getsign<char>(local_5c);
        pbVar6 = &local_2a0;
        buffer<char>::push_back
                  ((buffer<char> *)CONCAT62(in_stack_fffffffffffffc92,uVar8),
                   (char *)CONCAT17(c,uVar7));
      }
      convert_float<long_double>((convert_float_result<long_double> *)pbVar6,local_58);
      local_2c8 = (EVP_PKEY_CTX *)local_38.ptr_;
      sStack_2c0 = local_38.size_;
      format_hexfloat<long_double,_0>
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdc8);
      local_2d0 = local_38.capacity_;
      s_00 = buffer<char>::data(&local_2a0);
      count = buffer<char>::size(&local_2a0);
      basic_string_view<char>::basic_string_view(&local_2e0,s_00,count);
      out_00.container._2_2_ = in_stack_fffffffffffffcba;
      out_00.container._0_2_ = in_stack_fffffffffffffcb8;
      out_00.container._4_4_ = in_stack_fffffffffffffcbc;
      bytes.data_._2_2_ = in_stack_fffffffffffffcaa;
      bytes.data_._0_2_ = in_stack_fffffffffffffca8;
      bytes.data_._4_4_ = in_stack_fffffffffffffcac;
      bytes.size_ = in_stack_fffffffffffffcb0;
      local_38.grow_ =
           (grow_fun)
           write_bytes<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>>
                     (out_00,bytes,in_stack_fffffffffffffca0);
    }
    else {
      pbVar6 = &local_38;
      pVar2 = basic_specs::type((basic_specs *)pbVar6);
      if (pVar2 == debug) {
        in_stack_fffffffffffffcbc = local_84;
        iVar5 = max_value<int>();
        if (in_stack_fffffffffffffcbc == iVar5) {
          report_error((char *)in_stack_fffffffffffffca0);
        }
        local_84 = local_84 + 1;
        if (local_38.size_._4_4_ != 0) {
          pbVar6 = &local_38;
          basic_specs::set_alt((basic_specs *)pbVar6);
        }
      }
      else {
        pbVar6 = &local_38;
        pVar2 = basic_specs::type((basic_specs *)pbVar6);
        if (pVar2 == fixed) {
          if (local_38.size_._4_4_ != 0) {
            pbVar6 = &local_38;
            basic_specs::set_alt((basic_specs *)pbVar6);
          }
        }
        else if (local_84 == 0) {
          local_84 = 1;
        }
      }
      convert_float<long_double>((convert_float_result<long_double> *)pbVar6,local_58);
      loc_00.locale_ = (void *)in_ST0;
      uVar10 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      uVar8 = (undefined2)local_84;
      uVar9 = (undefined2)((uint)local_84 >> 0x10);
      std::integral_constant::operator_cast_to_bool(&local_2e9);
      iVar5 = format_float<long_double>
                        (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                         in_stack_fffffffffffffd90,(bool)in_stack_fffffffffffffd8f,
                         in_stack_fffffffffffffd80);
      local_38.size_ = CONCAT44(local_84,(int)local_38.size_);
      pbVar6 = &local_2a0;
      local_2e8 = iVar5;
      buffer<char>::data(pbVar6);
      buffer<char>::size(pbVar6);
      out_01.container._2_2_ = in_stack_fffffffffffffcba;
      out_01.container._0_2_ = uVar10;
      out_01.container._4_4_ = in_stack_fffffffffffffcbc;
      local_38.grow_ =
           (grow_fun)
           write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp>
                     (out_01,(big_decimal_fp *)CONCAT44(iVar5,CONCAT22(uVar9,uVar8)),
                      in_stack_fffffffffffffca0,(sign)((ulong)pbVar6 >> 0x20),loc_00);
    }
    local_2e4 = 1;
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x38e091);
  }
  else {
    local_68 = local_38.capacity_;
    isnan<long_double>(local_58);
    local_78 = (EVP_PKEY_CTX *)local_38.ptr_;
    local_70 = local_38.size_;
    specs_00.width = (int)in_stack_fffffffffffffcf0;
    specs_00.precision = (int)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
    specs_00.super_basic_specs = __x;
    local_38.grow_ =
         (grow_fun)
         write_nonfinite<char,fmt::v11::basic_appender<char>>
                   (in_stack_fffffffffffffcf8,(bool)isnan,specs_00,
                    CONCAT13(in_stack_fffffffffffffce3,
                             CONCAT12(in_stack_fffffffffffffce2,in_stack_fffffffffffffce0)));
  }
  return (basic_appender<char>)(buffer<char> *)local_38.grow_;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value, format_specs specs,
                                 locale_ref loc) -> OutputIt {
  // Use signbit because value < 0 is false for NaN.
  sign s = detail::signbit(value) ? sign::minus : specs.sign();

  if (!detail::isfinite(value))
    return write_nonfinite<Char>(out, detail::isnan(value), specs, s);

  if (specs.align() == align::numeric && s != sign::none) {
    *out++ = detail::getsign<Char>(s);
    s = sign::none;
    if (specs.width != 0) --specs.width;
  }

  int precision = specs.precision;
  if (precision < 0) {
    if (specs.type() != presentation_type::none) {
      precision = 6;
    } else if (is_fast_float<T>::value && !is_constant_evaluated()) {
      // Use Dragonbox for the shortest format.
      using floaty = conditional_t<sizeof(T) >= sizeof(double), double, float>;
      auto dec = dragonbox::to_decimal(static_cast<floaty>(value));
      return write_float<Char>(out, dec, specs, s, loc);
    }
  }

  memory_buffer buffer;
  if (specs.type() == presentation_type::hexfloat) {
    if (s != sign::none) buffer.push_back(detail::getsign<char>(s));
    format_hexfloat(convert_float(value), specs, buffer);
    return write_bytes<Char, align::right>(out, {buffer.data(), buffer.size()},
                                           specs);
  }

  if (specs.type() == presentation_type::exp) {
    if (precision == max_value<int>())
      report_error("number is too big");
    else
      ++precision;
    if (specs.precision != 0) specs.set_alt();
  } else if (specs.type() == presentation_type::fixed) {
    if (specs.precision != 0) specs.set_alt();
  } else if (precision == 0) {
    precision = 1;
  }
  int exp = format_float(convert_float(value), precision, specs,
                         std::is_same<T, float>(), buffer);

  specs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float<Char>(out, f, specs, s, loc);
}